

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_emu_d3d56.cc
# Opt level: O2

void __thiscall hwtest::pgraph::MthdEmuD3D56TlvUv::adjust_orig_mthd(MthdEmuD3D56TlvUv *this)

{
  mt19937 *this_00;
  uint32_t *puVar1;
  MthdTest *pMVar2;
  result_type rVar3;
  
  if (this->fin == true) {
    puVar1 = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.notify;
    *(byte *)puVar1 = (byte)*puVar1 & 0xfe;
    adjust_orig_icmd(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig);
  }
  if (((this->super_SingleMthdTest).super_MthdTest.cls == 0x48) && (this->fin == true)) {
    pMVar2 = &(this->super_SingleMthdTest).super_MthdTest;
    (pMVar2->super_StateTest).exp.valid[0] = 0;
    (pMVar2->super_StateTest).exp.valid[1] = 0;
  }
  this_00 = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test
             .rnd;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  if ((rVar3 & 1) != 0) {
    puVar1 = &(this->super_SingleMthdTest).super_MthdTest.val;
    *puVar1 = *puVar1 & 0xff800000;
    rVar3 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    puVar1 = &(this->super_SingleMthdTest).super_MthdTest.val;
    *puVar1 = *puVar1 ^ 1 << ((byte)rVar3 & 0x1f);
  }
  return;
}

Assistant:

void adjust_orig_mthd() override {
		if (fin) {
			insrt(orig.notify, 0, 1, 0);
			adjust_orig_icmd(&orig);
		}
		if (cls == 0x48 && fin) {
			// XXX: test me
			exp.valid[0] = 0;
			exp.valid[1] = 0;
		}
		if (rnd() & 1) {
			insrt(val, 0, 23, 0);
			val ^= 1 << (rnd() & 0x1f);
		}
	}